

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O1

void __thiscall
Diligent::ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>::
~ShaderVariableManagerBase
          (ShaderVariableManagerBase<Diligent::EngineVkImplTraits,_Diligent::ShaderVariableVkImpl>
           *this)

{
  string msg;
  string local_20;
  
  if (this->m_pVariables != (ShaderVariableVkImpl *)0x0) {
    FormatString<char[69]>
              (&local_20,
               (char (*) [69])"Destroy() has not been called. The shader variable memory will leak."
              );
    DebugAssertionFailed
              (local_20._M_dataplus._M_p,"~ShaderVariableManagerBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x340);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_20._M_dataplus._M_p != &local_20.field_2) {
      operator_delete(local_20._M_dataplus._M_p,local_20.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

~ShaderVariableManagerBase()
    {
        VERIFY(m_pVariables == nullptr, "Destroy() has not been called. The shader variable memory will leak.");
    }